

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

int baryonyx::itm::
    compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
              (solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
               *slv,bit_array *x,vector<int,_std::allocator<int>_> *out)

{
  pointer piVar1;
  iterator __position;
  bool bVar2;
  int local_24;
  
  piVar1 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  local_24 = 0;
  if (slv->m != 0) {
    do {
      bVar2 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
                        (slv,local_24,x);
      if (!bVar2) {
        __position._M_current =
             (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)out,__position,&local_24);
        }
        else {
          *__position._M_current = local_24;
          (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      local_24 = local_24 + 1;
    } while (local_24 != slv->m);
  }
  return (int)((ulong)((long)(out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
}

Assistant:

int
compute_violated_constraints(const Solver& slv,
                             const Xtype& x,
                             std::vector<int>& out)
{
    out.clear();

    for (int k = 0; k != slv.m; ++k)
        if (!is_valid_constraint(slv, k, x))
            out.emplace_back(k);

    return length(out);
}